

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_string.c
# Opt level: O2

char * nhr_string_copy_len(char *str,size_t len)

{
  char *__dest;
  
  if ((len != 0 && str != (char *)0x0) &&
     (__dest = (char *)nhr_malloc(len + 1), __dest != (char *)0x0)) {
    memcpy(__dest,str,len);
    __dest[len] = '\0';
    return __dest;
  }
  return (char *)0x0;
}

Assistant:

char * nhr_string_copy_len(const char * str, const size_t len) {
	char * s = (str && len > 0) ? (char *)nhr_malloc(len + 1) : NULL;
	if (s) {
		memcpy(s, str, len);
		s[len] = 0;
		return s;
	}
	return NULL;
}